

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_rb_seek_read(ma_rb *pRB,size_t offsetInBytes)

{
  uint uVar1;
  ma_result mVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  mVar2 = MA_INVALID_ARGS;
  if ((pRB != (ma_rb *)0x0) && (offsetInBytes <= pRB->subbufferSizeInBytes)) {
    uVar3 = pRB->encodedReadOffset & 0x7fffffff;
    uVar1 = pRB->encodedReadOffset & 0x80000000;
    if (uVar1 == (pRB->encodedWriteOffset & 0x80000000)) {
      uVar6 = (ulong)(pRB->encodedWriteOffset & 0x7fffffff);
      uVar4 = uVar3 + offsetInBytes;
      uVar5 = uVar4 & 0xffffffff;
      if (uVar6 < uVar4) {
        uVar5 = uVar6;
      }
    }
    else {
      uVar5 = uVar3 + offsetInBytes;
      if (pRB->subbufferSizeInBytes <= uVar5) {
        uVar1 = uVar1 + 0x80000000;
        uVar5 = (ulong)((int)uVar5 - pRB->subbufferSizeInBytes);
      }
    }
    LOCK();
    pRB->encodedReadOffset = uVar1 | (uint)uVar5;
    UNLOCK();
    mVar2 = MA_SUCCESS;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_rb_seek_read(ma_rb* pRB, size_t offsetInBytes)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 newReadOffsetInBytes;
    ma_uint32 newReadOffsetLoopFlag;

    if (pRB == NULL || offsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;
    }

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    newReadOffsetLoopFlag = readOffsetLoopFlag;

    /* We cannot go past the write buffer. */
    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        if ((readOffsetInBytes + offsetInBytes) > writeOffsetInBytes) {
            newReadOffsetInBytes = writeOffsetInBytes;
        } else {
            newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + offsetInBytes);
        }
    } else {
        /* May end up looping. */
        if ((readOffsetInBytes + offsetInBytes) >= pRB->subbufferSizeInBytes) {
            newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + offsetInBytes) - pRB->subbufferSizeInBytes;
            newReadOffsetLoopFlag ^= 0x80000000;    /* <-- Looped. */
        } else {
            newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + offsetInBytes);
        }
    }

    ma_atomic_exchange_32(&pRB->encodedReadOffset, ma_rb__construct_offset(newReadOffsetInBytes, newReadOffsetLoopFlag));
    return MA_SUCCESS;
}